

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O2

int testSpanTestsAccessImmutable(void)

{
  reference piVar1;
  ostream *poVar2;
  char *pcVar3;
  initializer_list<int> __l;
  allocator_type local_39;
  Span<const_int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> values;
  
  span.m_ptr = (pointer)0x200000001;
  span.m_size.m_size = 0x400000003;
  __l._M_len = 4;
  __l._M_array = (iterator)&span;
  std::vector<int,_std::allocator<int>_>::vector(&values,__l,&local_39);
  span.m_ptr = values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
  if ((long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == 0) {
    span.m_ptr = (pointer)0x0;
  }
  span.m_size.m_size =
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  piVar1 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::operator[](&span,0);
  if (*piVar1 == 1) {
    piVar1 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::At(&span,1);
    if (*piVar1 == 2) {
      MILBlob::Util::Span<const_int,_18446744073709551615UL>::At(&span,5);
      poVar2 = std::operator<<((ostream *)&std::clog,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xf3);
      std::operator<<(poVar2,": expected exception, but none thrown.\n");
      goto LAB_0017523e;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xf2);
    poVar2 = std::operator<<(poVar2,": error: ");
    pcVar3 = "(span.At(1)) == (2)";
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xf1);
    poVar2 = std::operator<<(poVar2,": error: ");
    pcVar3 = "(span[0]) == (1)";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar2);
LAB_0017523e:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&values.super__Vector_base<int,_std::allocator<int>_>);
  return 1;
}

Assistant:

int testSpanTestsAccessImmutable()
{
    const std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    ML_ASSERT_EQ(span[0], 1);
    ML_ASSERT_EQ(span.At(1), 2);
    ML_ASSERT_THROWS(span.At(5), std::range_error);

    static_assert(std::is_same<decltype(span[0]), const int&>::value, "span[0] should not be mutable");
    static_assert(std::is_same<decltype(span.At(0)), const int&>::value, "span.At(0) should not be mutable");

    return 0;
}